

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

bool cppwinrt::has_fastabi_tearoffs(writer *w,TypeDef *type)

{
  TypeDef *in_RCX;
  get_interfaces_t *pgVar1;
  byte bVar2;
  bool bVar3;
  get_interfaces_t local_20;
  get_interfaces_t *__return_storage_ptr__;
  
  __return_storage_ptr__ = &local_20;
  get_interfaces_abi_cxx11_(__return_storage_ptr__,(cppwinrt *)w,(writer *)type,in_RCX);
  for (; local_20.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_20.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_20.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_20.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    pgVar1 = (get_interfaces_t *)((ulong)__return_storage_ptr__ & 0xff);
    bVar3 = ((local_20.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second).is_default == false;
    __return_storage_ptr__ =
         (get_interfaces_t *)
         (ulong)((local_20.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second).fastabi;
    if (!bVar3) {
      __return_storage_ptr__ = pgVar1;
    }
    bVar2 = (byte)__return_storage_ptr__;
    if (bVar3) goto LAB_001081aa;
  }
  bVar2 = 0;
LAB_001081aa:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
  ::~vector(&local_20);
  return (bool)(bVar2 & 1);
}

Assistant:

bool has_fastabi_tearoffs(writer& w, TypeDef const& type)
    {
        for (auto&& [name, info] : get_interfaces(w, type))
        {
            if (info.is_default)
            {
                continue;
            }

            return info.fastabi;
        }

        return false;
    }